

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbitset_unit.c
# Opt level: O1

void test_next_bits_iterate(void)

{
  uint64_t *puVar1;
  _Bool _Var2;
  bitset_t *bitset;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint64_t uVar6;
  ulong uVar7;
  ulong uVar8;
  int i;
  ulong uVar9;
  unsigned_long a;
  unsigned_long uVar10;
  size_t buffer [3];
  ulong local_50 [4];
  
  uVar9 = 0;
  bitset = bitset_create();
  do {
    uVar4 = uVar9 >> 6;
    if ((uVar4 < bitset->arraysize) || (_Var2 = bitset_grow(bitset,uVar4 + 1), _Var2)) {
      bitset->array[uVar4] = bitset->array[uVar4] | 1L << ((byte)uVar9 & 0x3f);
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 != 100);
  uVar9 = 0x3e6;
  do {
    uVar9 = uVar9 + 2;
    uVar4 = uVar9 >> 6;
    if ((uVar4 < bitset->arraysize) || (_Var2 = bitset_grow(bitset,uVar4 + 1), _Var2)) {
      bitset->array[uVar4] = bitset->array[uVar4] | 1L << ((byte)uVar9 & 0x3e);
    }
  } while (uVar9 < 0x44a);
  uVar9 = 0;
  a = 0;
  do {
    uVar3 = uVar9 >> 6;
    uVar4 = bitset->arraysize;
    if (uVar3 < uVar4) {
      puVar1 = bitset->array;
      uVar6 = (puVar1[uVar3] >> ((byte)uVar9 & 0x3f)) << ((byte)uVar9 & 0x3f);
      uVar8 = uVar9 & 0xffffffffffffffc0;
      uVar5 = 0;
      do {
        while (uVar6 == 0) {
          uVar3 = uVar3 + 1;
          if (uVar3 == uVar4) goto LAB_00102f35;
          uVar8 = uVar8 + 0x40;
          uVar6 = puVar1[uVar3];
          if (2 < uVar5) goto LAB_00102f35;
        }
        uVar7 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
          }
        }
        local_50[uVar5 + 1] = uVar7 | uVar8;
        uVar7 = uVar6 - 1;
        if (uVar5 == 2) {
          uVar7 = 0xffffffffffffffff;
        }
        uVar5 = uVar5 + 1;
        uVar6 = uVar6 & uVar7;
      } while (uVar5 != 3);
      uVar5 = 3;
LAB_00102f35:
      if (uVar5 != 0) {
        uVar9 = local_50[uVar5];
      }
    }
    else {
      uVar5 = 0;
    }
    if (uVar5 == 0) {
      _assert_int_equal(a,0x96,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
                        ,0x37);
      bitset_free(bitset);
      return;
    }
    uVar10 = a * 2 + 800;
    uVar4 = 0;
    local_50[0] = uVar9;
    do {
      uVar9 = a + uVar4;
      if (99 < a + uVar4) {
        uVar9 = uVar10;
      }
      _assert_int_equal(local_50[uVar4 + 1],uVar9,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
                        ,0x33);
      uVar4 = uVar4 + 1;
      uVar10 = uVar10 + 2;
    } while (uVar5 != uVar4);
    uVar9 = local_50[0] + 1;
    a = a + uVar4;
  } while( true );
}

Assistant:

DEFINE_TEST(test_next_bits_iterate) {
    bitset_t *b = bitset_create();
    for (int i = 0; i < 100; i++) bitset_set(b, i);
    for (int i = 1000; i < 1100; i += 2) bitset_set(b, i);

    // Use an odd, small buffer size
    size_t buffer[3];
    size_t howmany = 0;
    size_t i = 0;
    for (size_t startfrom = 0;
         (howmany = bitset_next_set_bits(
              b, buffer, sizeof(buffer) / sizeof(buffer[0]), &startfrom)) > 0;
         startfrom++) {
        for (size_t j = 0; j < howmany; j++) {
            size_t expected;
            if (i < 100) {
                expected = i;
            } else {
                expected = 1000 + 2 * (i - 100);
            }
            assert_int_equal(buffer[j], expected);
            ++i;
        }
    }
    assert_int_equal(i, 150);
    bitset_free(b);
}